

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *gnuName,string *out,char *newExt)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  bVar1 = HasImplibGNUtoMS(this);
  if ((bVar1) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)gnuName);
    bVar1 = std::operator==(&bStack_48,".dll.a");
    std::__cxx11::string::~string((string *)&bStack_48);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&bStack_48,(ulong)gnuName);
      std::__cxx11::string::operator=((string *)out,(string *)&bStack_48);
      std::__cxx11::string::~string((string *)&bStack_48);
      std::__cxx11::string::append((char *)out);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& gnuName,
                                std::string& out, const char* newExt) const
{
  if(this->HasImplibGNUtoMS() &&
     gnuName.size() > 6 && gnuName.substr(gnuName.size()-6) == ".dll.a")
    {
    out = gnuName.substr(0, gnuName.size()-6);
    out += newExt? newExt : ".lib";
    return true;
    }
  return false;
}